

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::AudioTrack::~AudioTrack(AudioTrack *this)

{
  char *pcVar1;
  uint8_t *puVar2;
  ContentEncoding **ppCVar3;
  ContentEncoding *this_00;
  uint32_t i;
  ulong uVar4;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_00f731c8;
  pcVar1 = (this->super_Track).codec_id_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  puVar2 = (this->super_Track).codec_private_;
  if (puVar2 != (uint8_t *)0x0) {
    operator_delete__(puVar2);
  }
  pcVar1 = (this->super_Track).language_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  pcVar1 = (this->super_Track).name_;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  if ((this->super_Track).content_encoding_entries_ != (ContentEncoding **)0x0) {
    for (uVar4 = 0; ppCVar3 = (this->super_Track).content_encoding_entries_,
        uVar4 < (this->super_Track).content_encoding_entries_size_; uVar4 = uVar4 + 1) {
      this_00 = ppCVar3[uVar4];
      if (this_00 != (ContentEncoding *)0x0) {
        ContentEncoding::~ContentEncoding(this_00);
      }
      operator_delete(this_00);
    }
    if (ppCVar3 != (ContentEncoding **)0x0) {
      operator_delete__(ppCVar3);
      return;
    }
  }
  return;
}

Assistant:

Track::~Track() {
  delete[] codec_id_;
  delete[] codec_private_;
  delete[] language_;
  delete[] name_;

  if (content_encoding_entries_) {
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      delete encoding;
    }
    delete[] content_encoding_entries_;
  }
}